

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree.h
# Opt level: O0

node_type * __thiscall
st_tree::
tree<str1,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<str1>_>
::root(tree<str1,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<str1>_>
       *this)

{
  bool bVar1;
  empty_exception *this_00;
  allocator<char> local_31;
  string local_30;
  tree<str1,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<str1>_>
  *local_10;
  tree<str1,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<str1>_>
  *this_local;
  
  local_10 = this;
  bVar1 = empty(this);
  if (!bVar1) {
    return this->_root;
  }
  this_00 = (empty_exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"root(): empty tree has no root node",&local_31);
  empty_exception::empty_exception(this_00,&local_30);
  __cxa_throw(this_00,&empty_exception::typeinfo,empty_exception::~empty_exception);
}

Assistant:

const node_type& root() const {
        if (empty()) throw empty_exception("root(): empty tree has no root node");
        return *_root;
    }